

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O2

int testStateSpecificationVersion(void)

{
  bool bVar1;
  ResultType RVar2;
  ModelDescription *interface;
  FeatureDescription *feature;
  ostream *poVar3;
  int iVar4;
  char *pcVar5;
  ValidationPolicy validationPolicy;
  undefined1 local_70 [40];
  Model m;
  
  CoreML::Specification::Model::Model(&m);
  interface = CoreML::Specification::Model::_internal_mutable_description(&m);
  feature = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&interface->state_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"x",(allocator<char> *)&validationPolicy);
  setupStateFeature(feature,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  validationPolicy.allowsEmptyInput = true;
  validationPolicy.allowsEmptyOutput = true;
  validationPolicy.allowsMultipleFunctions = true;
  validationPolicy.allowsStatefulPrediction = true;
  CoreML::validateModelDescription((Result *)local_70,interface,8,&validationPolicy);
  bVar1 = CoreML::Result::good((Result *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x197);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar5 = 
    "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS17, validationPolicy))).good())"
    ;
  }
  else {
    CoreML::validateModelDescription((Result *)local_70,interface,8,&validationPolicy);
    RVar2 = CoreML::Result::type((Result *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 8));
    if (RVar2 == INVALID_COMPATIBILITY_VERSION) {
      CoreML::validateModelDescription((Result *)local_70,interface,9,&validationPolicy);
      bVar1 = CoreML::Result::good((Result *)local_70);
      std::__cxx11::string::~string((string *)(local_70 + 8));
      iVar4 = 0;
      if (bVar1) goto LAB_001393c1;
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x198);
      poVar3 = std::operator<<(poVar3,": error: ");
      pcVar5 = 
      "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
      ;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x197);
      poVar3 = std::operator<<(poVar3,": error: ");
      pcVar5 = 
      "((ResultType::INVALID_COMPATIBILITY_VERSION)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS17, validationPolicy)).type())"
      ;
    }
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar4 = 1;
LAB_001393c1:
  CoreML::Specification::Model::~Model(&m);
  return iVar4;
}

Assistant:

int testStateSpecificationVersion() {
    Specification::Model m;
    auto *description = m.mutable_description();
    setupStateFeature(description->add_state(), "x");

    // Check model specification version requirements.
    auto validationPolicy = validationPolicyForStateTests();
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS17, validationPolicy), ResultType::INVALID_COMPATIBILITY_VERSION);
    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    return 0;
}